

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int fits_read_ascii_region(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  double *pdVar1;
  char cVar2;
  shapeType sVar3;
  RgnShape *pRVar4;
  ushort *puVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  SAORegion *aRgn;
  byte *__s;
  FILE *__stream;
  char *pcVar11;
  size_t sVar12;
  byte *pbVar13;
  ushort **ppuVar14;
  RgnShape *pRVar15;
  anon_union_120_2_131c4ffb_for_param *paVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  size_t sVar21;
  byte *pbVar22;
  byte *pbVar23;
  WCSdata *pWVar24;
  WCSdata *pWVar25;
  byte *pbVar26;
  char *err_message;
  size_t __size;
  byte *pbVar27;
  byte *pbVar28;
  bool bVar29;
  byte bVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  char *endp;
  double y;
  double x;
  uint local_dc;
  double local_98;
  char *local_90;
  ushort **local_88;
  anon_union_120_2_131c4ffb_for_param *local_80;
  WCSdata *local_78;
  double local_70;
  double local_68;
  double local_60;
  double *local_58;
  char *local_50;
  double local_48;
  double local_40;
  size_t local_38;
  
  bVar30 = 0;
  if (*status != 0) {
    return *status;
  }
  aRgn = (SAORegion *)malloc(0x58);
  if (aRgn != (SAORegion *)0x0) {
    aRgn->nShapes = 0;
    aRgn->Shapes = (RgnShape *)0x0;
    if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
      (aRgn->wcs).exists = 0;
    }
    else {
      pWVar24 = wcs;
      pWVar25 = &aRgn->wcs;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        uVar31 = *(undefined4 *)&pWVar24->field_0x4;
        pWVar25->exists = pWVar24->exists;
        *(undefined4 *)&pWVar25->field_0x4 = uVar31;
        pWVar24 = (WCSdata *)((long)pWVar24 + (ulong)bVar30 * -0x10 + 8);
        pWVar25 = (WCSdata *)((long)pWVar25 + (ulong)bVar30 * -0x10 + 8);
      }
    }
    __s = (byte *)malloc(0x200);
    if (__s != (byte *)0x0) {
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        snprintf((char *)__s,0x200,"Could not open Region file %s.",filename);
        ffpmsg((char *)__s);
        free(__s);
        free(aRgn);
        *status = 0x68;
        return 0x68;
      }
      *status = 0x68;
      pcVar11 = fgets((char *)__s,0x200,__stream);
      if (pcVar11 != (char *)0x0) {
        local_50 = wcs->type;
        local_58 = &wcs->rot;
        sVar21 = 0x200;
        iVar8 = 0;
        local_70 = 0.0;
        local_98 = 0.0;
        local_78 = wcs;
        do {
          *status = 0;
          sVar12 = strlen((char *)__s);
          __size = sVar21;
          if (sVar12 == sVar21 - 1) {
            do {
              __size = sVar21;
              if (__s[sVar12 - 1] == 10) break;
              __size = sVar21 * 2;
              pbVar13 = (byte *)realloc(__s,__size);
              if (pbVar13 == (byte *)0x0) {
                ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
                *status = 0x71;
                goto LAB_001fc840;
              }
              fgets((char *)(pbVar13 + sVar12),(int)sVar21 + 1,__stream);
              sVar21 = strlen((char *)(pbVar13 + sVar12));
              sVar12 = sVar12 + sVar21;
              sVar21 = __size;
              __s = pbVar13;
            } while (sVar12 == __size - 1);
          }
          local_38 = __size;
          if (*__s == 0x23) {
            ppuVar14 = __ctype_b_loc();
            pbVar13 = __s + 7;
            pbVar26 = __s;
            do {
              pbVar27 = pbVar13;
              pbVar22 = pbVar26 + 1;
              pbVar26 = pbVar26 + 1;
              pbVar13 = pbVar27 + 1;
            } while ((*(byte *)((long)*ppuVar14 + (long)(char)*pbVar22 * 2 + 1) & 0x20) != 0);
            iVar7 = fits_strncasecmp((char *)pbVar26,"format:",7);
            if (iVar7 == 0) {
              if (aRgn->nShapes != 0) {
                ffpmsg("Format code encountered after reading 1 or more shapes.");
                *status = 0x1af;
                goto LAB_001fc840;
              }
              do {
                pbVar13 = pbVar27 + 1;
                pbVar27 = pbVar27 + 1;
              } while ((*(byte *)((long)*ppuVar14 + (long)(char)*pbVar13 * 2 + 1) & 0x20) != 0);
              iVar8 = fits_strncasecmp((char *)pbVar27,"pixel",5);
              if (iVar8 == 0) {
                iVar8 = 0;
              }
              else {
                iVar8 = fits_strncasecmp((char *)pbVar27,"degree",6);
                if (iVar8 == 0) {
                  iVar8 = 1;
                }
                else {
                  iVar7 = fits_strncasecmp((char *)pbVar27,"hhmmss",6);
                  iVar8 = 2;
                  if ((iVar7 != 0) &&
                     (iVar7 = fits_strncasecmp((char *)pbVar27,"hms",3), iVar7 != 0)) {
                    ffpmsg("Unknown format code encountered in region file.");
                    *status = 0x1af;
                    goto LAB_001fc840;
                  }
                }
              }
            }
          }
          else {
            iVar7 = fits_strncasecmp((char *)__s,"glob",4);
            if (iVar7 != 0) {
              bVar30 = *__s;
              pbVar13 = __s;
joined_r0x001fb944:
              pbVar26 = pbVar13;
              if (bVar30 != 0) {
                do {
                  if (*status == 0) {
                    uVar10 = 1;
                    bVar29 = false;
                    pbVar22 = (byte *)0x0;
                    pbVar27 = pbVar26;
LAB_001fbb11:
                    bVar30 = *pbVar27;
                    if (0x39 < bVar30) {
                      if (bVar30 == 0x3a) {
                        iVar7 = 2;
                      }
                      else {
                        if (bVar30 != 100) goto switchD_001fbb2a_caseD_24;
                        iVar7 = 1;
                      }
                      if (pbVar22 != (byte *)0x0) {
                        iVar8 = iVar7;
                      }
                      goto LAB_001fbbb0;
                    }
                    pbVar23 = pbVar22;
                    pbVar13 = pbVar27;
                    switch(bVar30) {
                    case 0x23:
                      goto switchD_001fbb2a_caseD_23;
                    case 0x24:
                    case 0x25:
                    case 0x26:
                    case 0x27:
                    case 0x2a:
                    case 0x2b:
                      goto switchD_001fbb2a_caseD_24;
                    case 0x28:
                      *pbVar27 = 0;
                      pbVar23 = pbVar27 + 1;
                      if (pbVar22 != (byte *)0x0) {
                        *status = 1;
                        goto LAB_001fbbb0;
                      }
                      bVar29 = false;
                      pbVar13 = pbVar23;
                      break;
                    case 0x29:
                      *pbVar27 = 0;
                      bVar29 = true;
                      pbVar13 = pbVar27 + 1;
                      if (pbVar22 == (byte *)0x0) {
                        *status = 1;
                        pbVar22 = (byte *)0x0;
                        goto LAB_001fbbb0;
                      }
                      break;
                    case 0x2c:
                      uVar10 = uVar10 + 1;
                      goto switchD_001fbb2a_caseD_24;
                    default:
                      if (bVar30 != 10) {
                        if (bVar30 != 0) goto switchD_001fbb2a_caseD_24;
                        goto LAB_001fb982;
                      }
switchD_001fbb2a_caseD_23:
                      *pbVar27 = 0;
                      bVar29 = pbVar22 == (byte *)0x0;
                    }
                    goto LAB_001fbbb2;
                  }
                  uVar10 = 1;
                  bVar29 = false;
                  pbVar23 = (byte *)0x0;
                  pbVar13 = pbVar26;
LAB_001fb982:
                  if ((!bVar29) || (*status != 0)) {
LAB_001fc87a:
                    pcVar11 = "Error reading Region file";
LAB_001fc881:
                    ffpmsg(pcVar11);
                    *status = 0x1af;
                    goto LAB_001fc840;
                  }
                  ppuVar14 = __ctype_b_loc();
                  pcVar11 = (char *)(pbVar26 + -1);
                  do {
                    pbVar26 = (byte *)pcVar11;
                    pcVar11 = (char *)(pbVar26 + 1);
                  } while ((*(byte *)((long)*ppuVar14 + (long)(char)pbVar26[1] * 2 + 1) & 0x20) != 0
                          );
                  if ((pbVar26[1] == 0) && (iVar7 = iVar8, pbVar23 == (byte *)0x0))
                  goto LAB_001fbaf0;
                  local_88 = ppuVar14;
                  iVar7 = fits_strncasecmp(pcVar11,"image;",6);
                  if (iVar7 != 0) {
                    iVar7 = fits_strncasecmp(pcVar11,"physical;",9);
                    if (iVar7 == 0) {
                      pcVar11 = (char *)(pbVar26 + 10);
                      goto LAB_001fbbe5;
                    }
                    iVar7 = fits_strncasecmp(pcVar11,"linear;",7);
                    if (iVar7 == 0) {
                      pcVar11 = (char *)(pbVar26 + 8);
                      goto LAB_001fbbe5;
                    }
                    iVar7 = fits_strncasecmp(pcVar11,"fk4;",4);
                    if ((iVar7 == 0) || (iVar7 = fits_strncasecmp(pcVar11,"fk5;",4), iVar7 == 0)) {
                      pcVar11 = (char *)(pbVar26 + 5);
LAB_001fbbed:
                      iVar8 = 1;
                      goto LAB_001fbbf7;
                    }
                    iVar7 = fits_strncasecmp(pcVar11,"icrs;",5);
                    if (iVar7 == 0) {
                      pcVar11 = (char *)(pbVar26 + 6);
                      goto LAB_001fbbed;
                    }
                    iVar9 = fits_strncasecmp(pcVar11,"fk5",3);
                    iVar7 = 1;
                    if (((iVar9 != 0) && (iVar9 = fits_strncasecmp(pcVar11,"fk4",3), iVar9 != 0)) &&
                       (iVar9 = fits_strncasecmp(pcVar11,"icrs",4), iVar9 != 0)) {
                      iVar9 = fits_strncasecmp(pcVar11,"image",5);
                      iVar7 = 0;
                      if ((iVar9 != 0) &&
                         (iVar9 = fits_strncasecmp(pcVar11,"physical",8), iVar9 != 0)) {
                        iVar7 = fits_strncasecmp(pcVar11,"galactic;",9);
                        if (iVar7 != 0) {
                          iVar7 = fits_strncasecmp(pcVar11,"ecliptic;",9);
                          if (iVar7 == 0) {
                            err_message = "ecliptic region coordinates not supported";
                            goto LAB_001fc9bd;
                          }
                          goto LAB_001fbbf7;
                        }
                        err_message = "Galactic region coordinates not supported";
LAB_001fc9bd:
                        ffpmsg(err_message);
                        goto LAB_001fc881;
                      }
                    }
                    goto LAB_001fbaf0;
                  }
                  pcVar11 = (char *)(pbVar26 + 7);
LAB_001fbbe5:
                  iVar8 = 0;
LAB_001fbbf7:
                  uVar18 = aRgn->nShapes * -0x33333333 + 0x19999998;
                  if ((uVar18 >> 1 | (uint)((uVar18 & 1) != 0) << 0x1f) < 0x19999999) {
                    if (aRgn->Shapes == (RgnShape *)0x0) {
                      pRVar15 = (RgnShape *)malloc(0x690);
                    }
                    else {
                      pRVar15 = (RgnShape *)realloc(aRgn->Shapes,(long)aRgn->nShapes * 0xa8 + 0x690)
                      ;
                    }
                    if (pRVar15 == (RgnShape *)0x0) {
                      ffpmsg("Failed to allocate memory for Region data");
                      *status = 0x71;
                      goto LAB_001fc840;
                    }
                    aRgn->Shapes = pRVar15;
                  }
                  pRVar4 = aRgn->Shapes;
                  iVar7 = aRgn->nShapes;
                  aRgn->nShapes = iVar7 + 1;
                  pRVar15 = pRVar4 + iVar7;
                  pRVar4[iVar7].sign = '\x01';
                  pRVar4[iVar7].shape = point_rgn;
                  pRVar4[iVar7].param.gen.p[0] = 0.0;
                  *(undefined8 *)((long)&pRVar4[iVar7].param + 8) = 0;
                  pdVar1 = pRVar4[iVar7].param.gen.p + 2;
                  *pdVar1 = 0.0;
                  pdVar1[1] = 0.0;
                  pdVar1 = pRVar4[iVar7].param.gen.p + 4;
                  *pdVar1 = 0.0;
                  pdVar1[1] = 0.0;
                  pdVar1 = pRVar4[iVar7].param.gen.p + 6;
                  *pdVar1 = 0.0;
                  pdVar1[1] = 0.0;
                  pdVar1 = &pRVar4[iVar7].param.gen.sinT;
                  *pdVar1 = 0.0;
                  pdVar1[1] = 0.0;
                  pdVar1 = &pRVar4[iVar7].param.gen.a;
                  *pdVar1 = 0.0;
                  pdVar1[1] = 0.0;
                  puVar5 = *local_88;
                  do {
                    pbVar26 = (byte *)pcVar11;
                    bVar30 = *pbVar26;
                    pcVar11 = (char *)(pbVar26 + 1);
                  } while ((*(byte *)((long)puVar5 + (long)(char)bVar30 * 2 + 1) & 0x20) != 0);
                  pbVar22 = (byte *)pcVar11;
                  if ((bVar30 != 0x2b) && (pbVar22 = pbVar26, bVar30 == 0x2d)) {
                    pRVar15->sign = '\0';
                    pbVar22 = (byte *)pcVar11;
                  }
                  local_80 = &pRVar15->param;
                  pbVar26 = pbVar22 + -1;
                  do {
                    pcVar11 = (char *)pbVar22;
                    pbVar27 = pbVar26;
                    pbVar26 = pbVar27 + 1;
                    pbVar22 = (byte *)pcVar11 + 1;
                  } while ((*(byte *)((long)puVar5 + (long)*pcVar11 * 2 + 1) & 0x20) != 0);
                  if (*pcVar11 == 0) goto LAB_001fc87a;
                  sVar21 = strlen(pcVar11);
                  if ((*(byte *)((long)*local_88 + (long)(char)((byte *)pcVar11)[sVar21 - 1] * 2 + 1
                                ) & 0x20) != 0) {
                    pbVar27 = pbVar27 + sVar21;
                    do {
                      *pbVar27 = 0;
                      pbVar26 = pbVar27 + -1;
                      pbVar27 = pbVar27 + -1;
                    } while ((*(byte *)((long)*local_88 + (long)(char)*pbVar26 * 2 + 1) & 0x20) != 0
                            );
                  }
                  iVar7 = fits_strcasecmp(pcVar11,"circle");
                  if (iVar7 == 0) {
                    pRVar15->shape = circle_rgn;
                    if (uVar10 == 3) {
LAB_001fbf39:
                      local_dc = 2;
                      goto LAB_001fc095;
                    }
LAB_001fbf58:
                    local_dc = 2;
                    *status = 0x1af;
                  }
                  else {
                    iVar7 = fits_strcasecmp(pcVar11,"annulus");
                    if (iVar7 == 0) {
                      pRVar15->shape = annulus_rgn;
                      if (uVar10 == 4) goto LAB_001fbf39;
                      goto LAB_001fbf58;
                    }
                    iVar7 = fits_strcasecmp(pcVar11,"ellipse");
                    if (iVar7 == 0) {
                      if (0xfffffffa < uVar10 - 9) {
                        if ((int)uVar10 < 6) {
                          pRVar15->shape = ellipse_rgn;
                          goto LAB_001fc085;
                        }
                        pRVar15->shape = elliptannulus_rgn;
                        goto LAB_001fc018;
                      }
LAB_001fbf91:
                      *status = 0x1af;
LAB_001fc08d:
                      local_dc = 2;
                    }
                    else {
                      iVar7 = fits_strcasecmp(pcVar11,"elliptannulus");
                      if (iVar7 == 0) {
                        pRVar15->shape = elliptannulus_rgn;
                        if ((uVar10 != 6) && (uVar10 != 8)) {
                          *status = 0x1af;
                        }
LAB_001fc018:
                        (pRVar15->param).gen.p[6] = 0.0;
                        (pRVar15->param).gen.p[7] = 0.0;
                        goto LAB_001fc08d;
                      }
                      iVar7 = fits_strcasecmp(pcVar11,"box");
                      if ((iVar7 == 0) || (iVar7 = fits_strcasecmp(pcVar11,"rotbox"), iVar7 == 0)) {
                        if (uVar10 - 9 < 0xfffffffb) goto LAB_001fbf91;
                        if ((int)uVar10 < 6) {
                          pRVar15->shape = box_rgn;
                          goto LAB_001fc085;
                        }
                        pRVar15->shape = boxannulus_rgn;
                        goto LAB_001fc018;
                      }
                      iVar7 = fits_strcasecmp(pcVar11,"rectangle");
                      if ((iVar7 == 0) ||
                         (iVar7 = fits_strcasecmp(pcVar11,"rotrectangle"), iVar7 == 0)) {
                        pRVar15->shape = rectangle_rgn;
                        if (uVar10 - 6 < 0xfffffffe) {
                          *status = 0x1af;
                        }
                        (pRVar15->param).gen.p[4] = 0.0;
                        local_dc = 4;
                        goto LAB_001fc095;
                      }
                      iVar7 = fits_strcasecmp(pcVar11,"diamond");
                      if ((((iVar7 == 0) ||
                           (iVar7 = fits_strcasecmp(pcVar11,"rotdiamond"), iVar7 == 0)) ||
                          (iVar7 = fits_strcasecmp(pcVar11,"rhombus"), iVar7 == 0)) ||
                         (iVar7 = fits_strcasecmp(pcVar11,"rotrhombus"), iVar7 == 0)) {
                        pRVar15->shape = diamond_rgn;
                        if (uVar10 - 6 < 0xfffffffe) {
                          *status = 0x1af;
                        }
LAB_001fc085:
                        (pRVar15->param).gen.p[4] = 0.0;
                        goto LAB_001fc08d;
                      }
                      iVar7 = fits_strcasecmp(pcVar11,"sector");
                      if ((iVar7 == 0) || (iVar7 = fits_strcasecmp(pcVar11,"pie"), iVar7 == 0)) {
                        pRVar15->shape = sector_rgn;
                        local_dc = 2;
joined_r0x001fc64b:
                        if (uVar10 != 4) {
LAB_001fc66f:
                          *status = 0x1af;
                        }
                      }
                      else {
                        iVar7 = fits_strcasecmp(pcVar11,"point");
                        if (iVar7 == 0) {
                          pRVar15->shape = point_rgn;
                          local_dc = 2;
                          if (uVar10 != 2) goto LAB_001fc66f;
                        }
                        else {
                          iVar7 = fits_strcasecmp(pcVar11,"line");
                          if (iVar7 == 0) {
                            pRVar15->shape = line_rgn;
                            local_dc = 4;
                            goto joined_r0x001fc64b;
                          }
                          iVar7 = fits_strcasecmp(pcVar11,"polygon");
                          if (iVar7 == 0) {
                            pRVar15->shape = poly_rgn;
                            local_dc = uVar10;
                            if ((int)uVar10 < 6 || (uVar10 & 1) != 0) {
                              *status = 0x1af;
                            }
                          }
                          else {
                            iVar7 = fits_strcasecmp(pcVar11,"panda");
                            if (iVar7 == 0) {
                              pRVar15->shape = panda_rgn;
                              local_dc = 2;
                              if (uVar10 != 8) goto LAB_001fc66f;
                            }
                            else {
                              iVar7 = fits_strcasecmp(pcVar11,"epanda");
                              if (iVar7 == 0) {
                                pRVar15->shape = epanda_rgn;
                              }
                              else {
                                iVar7 = fits_strcasecmp(pcVar11,"bpanda");
                                if (iVar7 != 0) {
                                  ffpmsg("Unrecognized region found in region file:");
                                  goto LAB_001fc881;
                                }
                                pRVar15->shape = bpanda_rgn;
                              }
                              if (uVar10 - 0xc < 0xfffffffe) {
                                *status = 0x1af;
                              }
                              (pRVar15->param).gen.p[10] = 0.0;
                              local_dc = 2;
                            }
                          }
                        }
                      }
                    }
                  }
LAB_001fc095:
                  if (*status != 0) {
                    ffpmsg("Wrong number of parameters found for region");
                    ffpmsg(pcVar11);
                    goto LAB_001fc840;
                  }
                  paVar16 = local_80;
                  if (pRVar15->shape == poly_rgn) {
                    paVar16 = (anon_union_120_2_131c4ffb_for_param *)malloc((long)(int)uVar10 << 3);
                    (pRVar15->param).poly.Pts = (double *)paVar16;
                    if (paVar16 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
                      ffpmsg("Could not allocate memory to hold polygon parameters");
                      *status = 0x71;
                      goto LAB_001fc840;
                    }
                    (local_80->poly).nPts = uVar10;
                  }
                  if ((int)local_dc < 1) {
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = 0;
                    pbVar26 = pbVar23;
                    local_80 = paVar16;
                    do {
                      local_48 = local_98;
                      local_40 = local_70;
                      pbVar22 = pbVar26 + 2;
                      pbVar27 = pbVar26;
                      do {
                        pbVar28 = pbVar27;
                        pbVar23 = pbVar22;
                        pbVar22 = pbVar23 + 1;
                        pbVar27 = pbVar28 + 1;
                      } while (*pbVar28 != 0x2c);
                      *pbVar28 = 0;
                      for (; (pbVar23[-1] != 0 && (pbVar23[-1] != 0x2c)); pbVar23 = pbVar23 + 1) {
                      }
                      pbVar23[-1] = 0;
                      pcVar11 = strchr((char *)pbVar26,0x3a);
                      if (pcVar11 == (char *)0x0) {
                        dVar34 = atof((char *)pbVar26);
                        dVar33 = atof((char *)(pbVar28 + 1));
                      }
                      else {
                        lVar19 = strtol((char *)pbVar26,&local_90,10);
                        uVar31 = 0;
                        uVar32 = 0;
                        if ((local_90 == (char *)0x0) || (*local_90 != ':')) {
                          lVar17 = 0;
                        }
                        else {
                          lVar17 = strtol(local_90 + 1,&local_90,10);
                          if (local_90 == (char *)0x0) {
                            uVar31 = 0;
                            uVar32 = 0;
                          }
                          else {
                            uVar31 = 0;
                            uVar32 = 0;
                            if (*local_90 == ':') {
                              dVar34 = atof(local_90 + 1);
                              uVar31 = SUB84(dVar34,0);
                              uVar32 = (undefined4)((ulong)dVar34 >> 0x20);
                            }
                          }
                        }
                        do {
                          bVar30 = pbVar28[1];
                          pbVar28 = pbVar28 + 1;
                        } while ((*(byte *)((long)*local_88 + (long)(char)bVar30 * 2 + 1) & 0x20) !=
                                 0);
                        dVar34 = ((double)CONCAT44(uVar32,uVar31) / 3600.0 +
                                 (double)lVar17 / 60.0 + (double)lVar19) * 15.0;
                        lVar19 = strtol((char *)(pbVar28 + (bVar30 == 0x2d)),&local_90,10);
                        dVar33 = 0.0;
                        if ((local_90 == (char *)0x0) || (*local_90 != ':')) {
                          lVar17 = 0;
                        }
                        else {
                          lVar17 = strtol(local_90 + 1,&local_90,10);
                          if (local_90 == (char *)0x0) {
                            dVar33 = 0.0;
                          }
                          else {
                            dVar33 = 0.0;
                            if (*local_90 == ':') {
                              dVar33 = atof(local_90 + 1);
                            }
                          }
                        }
                        if (bVar30 == 0x2d) {
                          dVar6 = (double)lVar17 / -60.0 + (double)-lVar19;
                          dVar33 = dVar33 / -3600.0;
                        }
                        else {
                          dVar6 = (double)lVar17 / 60.0 + (double)lVar19;
                          dVar33 = dVar33 / 3600.0;
                        }
                        dVar33 = dVar33 + dVar6;
                        iVar8 = 2;
                      }
                      local_98 = dVar34;
                      local_70 = dVar33;
                      if (uVar20 != 0) {
                        local_98 = local_48;
                        local_70 = local_40;
                      }
                      if (iVar8 != 0) {
                        if ((local_78 == (WCSdata *)0x0) || (local_78->exists == 0)) {
                          ffpmsg("WCS information needed to convert region coordinates.");
                          *status = 0x1f9;
                          goto LAB_001fc840;
                        }
                        iVar7 = ffxypx(dVar34,dVar33,local_78->xrefval,local_78->yrefval,
                                       local_78->xrefpix,local_78->yrefpix,local_78->xinc,
                                       local_78->yinc,local_78->rot,local_50,&local_60,&local_68,
                                       status);
                        dVar34 = local_60;
                        dVar33 = local_68;
                        if (iVar7 != 0) {
                          ffpmsg("Error converting region to pixel coordinates.");
                          goto LAB_001fc840;
                        }
                      }
                      *(double *)((long)local_80 + uVar20 * 8) = dVar34;
                      *(double *)((long)local_80 + uVar20 * 8 + 8) = dVar33;
                      uVar20 = uVar20 + 2;
                      pbVar26 = pbVar23;
                      paVar16 = local_80;
                    } while ((int)uVar20 < (int)local_dc);
                  }
                  pWVar24 = local_78;
                  if ((int)uVar20 < (int)uVar10) {
                    uVar20 = uVar20 & 0xffffffff;
                    pbVar26 = pbVar23;
LAB_001fc40f:
                    do {
                      pbVar22 = pbVar23;
                      pbVar23 = pbVar22 + 1;
                      if (*pbVar22 != 0) {
                        if (*pbVar22 != 0x2c) goto LAB_001fc40f;
                      }
                      *pbVar22 = 0;
                      dVar34 = strtod((char *)pbVar26,&local_90);
                      *(double *)((long)paVar16 + uVar20 * 8) = dVar34;
                      if ((local_90 != (char *)0x0) &&
                         (((cVar2 = *local_90, cVar2 == '\"' || (cVar2 == 'd')) || (cVar2 == '\'')))
                         ) {
                        dVar33 = 60.0;
                        if (cVar2 != '\'') {
                          dVar33 = *(double *)(&DAT_0021ccd0 + (ulong)(cVar2 == '\"') * 8);
                        }
                        iVar7 = ffxypx(local_98,(double)(~-(ulong)(local_70 < 0.0) & (ulong)-dVar34
                                                        | -(ulong)(local_70 < 0.0) & (ulong)dVar34)
                                                / dVar33 + local_70,pWVar24->xrefval,
                                       pWVar24->yrefval,pWVar24->xrefpix,pWVar24->yrefpix,
                                       pWVar24->xinc,pWVar24->yinc,pWVar24->rot,local_50,&local_60,
                                       &local_68,status);
                        if (iVar7 != 0) {
                          ffpmsg("Error converting region to pixel coordinates.");
                          goto LAB_001fc840;
                        }
                        dVar33 = local_60 - (paVar16->gen).p[0];
                        dVar34 = local_68 - (paVar16->gen).p[1];
                        dVar34 = dVar34 * dVar34 + dVar33 * dVar33;
                        if (dVar34 < 0.0) {
                          dVar34 = sqrt(dVar34);
                        }
                        else {
                          dVar34 = SQRT(dVar34);
                        }
                        *(double *)((long)paVar16 + uVar20 * 8) = dVar34;
                      }
                      uVar20 = uVar20 + 1;
                      pbVar26 = pbVar23;
                    } while ((int)uVar20 < (int)uVar10);
                  }
                  sVar3 = pRVar15->shape;
                  if (((sVar3 == elliptannulus_rgn) || (sVar3 == boxannulus_rgn)) && (uVar10 == 7))
                  {
                    (paVar16->gen).p[7] = (paVar16->gen).p[6];
                  }
                  if (iVar8 != 0) {
                    switch(sVar3) {
                    case ellipse_rgn:
                    case box_rgn:
                    case rectangle_rgn:
                    case diamond_rgn:
                      lVar19 = 0x20;
                      goto LAB_001fc613;
                    case elliptannulus_rgn:
                    case boxannulus_rgn:
                      lVar19 = 0x38;
                      lVar17 = 0x30;
                      break;
                    case sector_rgn:
                    case panda_rgn:
                      lVar19 = 0x18;
                      lVar17 = 0x10;
                      break;
                    default:
                      goto switchD_001fc5c8_caseD_b;
                    case epanda_rgn:
                    case bpanda_rgn:
                      (paVar16->gen).p[2] = *local_58 + (paVar16->gen).p[2];
                      lVar19 = 0x50;
                      lVar17 = 0x18;
                    }
                    *(double *)((long)paVar16 + lVar17) =
                         *local_58 + *(double *)((long)paVar16 + lVar17);
LAB_001fc613:
                    *(double *)((long)paVar16 + lVar19) =
                         *local_58 + *(double *)((long)paVar16 + lVar19);
                  }
switchD_001fc5c8_caseD_b:
                  fits_setup_shape(pRVar15);
                  pbVar26 = pbVar13;
                  if (*pbVar13 == 0) break;
                } while( true );
              }
            }
          }
          sVar21 = local_38;
          pcVar11 = fgets((char *)__s,(int)local_38,__stream);
        } while (pcVar11 != (char *)0x0);
      }
      fits_set_region_components(aRgn);
LAB_001fc840:
      if (*status == 0) {
        *Rgn = aRgn;
      }
      else {
        fits_free_region(aRgn);
      }
      fclose(__stream);
      free(__s);
      return *status;
    }
    free(aRgn);
  }
  ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
  *status = 0x71;
  return 0x71;
switchD_001fbb2a_caseD_24:
LAB_001fbbb0:
  bVar29 = false;
  pbVar23 = pbVar22;
  pbVar13 = pbVar27 + 1;
LAB_001fbbb2:
  if ((bVar29) || (pbVar22 = pbVar23, pbVar27 = pbVar13, *status != 0)) goto LAB_001fb982;
  goto LAB_001fbb11;
LAB_001fbaf0:
  bVar30 = *pbVar13;
  iVar8 = iVar7;
  goto joined_r0x001fb944;
}

Assistant:

int fits_read_ascii_region( const char *filename,
			    WCSdata    *wcs,
			    SAORegion  **Rgn,
			    int        *status )
/*  Read regions from a SAO-style region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
   char     *currLine;
   char     *namePtr, *paramPtr, *currLoc;
   char     *pX, *pY, *endp;
   long     allocLen, lineLen, hh, mm, dd;
   double   *coords, X, Y, x, y, ss, div, xsave= 0., ysave= 0.;
   int      nParams, nCoords, negdec;
   int      i, done;
   FILE     *rgnFile;
   coordFmt cFmt;
   SAORegion *aRgn;
   RgnShape *newShape, *tmpShape;

   if( *status ) return( *status );

   aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
   if( ! aRgn ) {
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   aRgn->nShapes    =    0;
   aRgn->Shapes     = NULL;
   if( wcs && wcs->exists )
      aRgn->wcs = *wcs;
   else
      aRgn->wcs.exists = 0;

   cFmt = pixel_fmt; /* set default format */

   /*  Allocate Line Buffer  */

   allocLen = 512;
   currLine = (char *)malloc( allocLen * sizeof(char) );
   if( !currLine ) {
      free( aRgn );
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }

   /*  Open Region File  */

   if( (rgnFile = fopen( filename, "r" ))==NULL ) {
      snprintf(currLine,allocLen,"Could not open Region file %s.",filename);
      ffpmsg( currLine );
      free( currLine );
      free( aRgn );
      return( *status = FILE_NOT_OPENED );
   }
   
   /*  Read in file, line by line  */
   /*  First, set error status in case file is empty */ 
   *status = FILE_NOT_OPENED;

   while( fgets(currLine,allocLen,rgnFile) != NULL ) {

      /* reset status if we got here */
      *status = 0;

      /*  Make sure we have a full line of text  */

      lineLen = strlen(currLine);
      while( lineLen==allocLen-1 && currLine[lineLen-1]!='\n' ) {
         currLoc = (char *)realloc( currLine, 2 * allocLen * sizeof(char) );
         if( !currLoc ) {
            ffpmsg("Couldn't allocate memory to hold Region file contents.");
            *status = MEMORY_ALLOCATION;
            goto error;
         } else {
            currLine = currLoc;
         }
         fgets( currLine+lineLen, allocLen+1, rgnFile );
         allocLen += allocLen;
         lineLen  += strlen(currLine+lineLen);
      }

      currLoc = currLine;
      if( *currLoc == '#' ) {

         /*  Look to see if it is followed by a format statement...  */
         /*  if not skip line                                        */

         currLoc++;
         while( isspace(*currLoc) ) currLoc++;
         if( !fits_strncasecmp( currLoc, "format:", 7 ) ) {
            if( aRgn->nShapes ) {
               ffpmsg("Format code encountered after reading 1 or more shapes.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            currLoc += 7;
            while( isspace(*currLoc) ) currLoc++;
            if( !fits_strncasecmp( currLoc, "pixel", 5 ) ) {
               cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( currLoc, "degree", 6 ) ) {
               cFmt = degree_fmt;
            } else if( !fits_strncasecmp( currLoc, "hhmmss", 6 ) ) {
               cFmt = hhmmss_fmt;
            } else if( !fits_strncasecmp( currLoc, "hms", 3 ) ) {
               cFmt = hhmmss_fmt;
            } else {
               ffpmsg("Unknown format code encountered in region file.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
         }

      } else if( !fits_strncasecmp( currLoc, "glob", 4 ) ) {
		  /* skip lines that begin with the word 'global' */

      } else {

         while( *currLoc != '\0' ) {

            namePtr  = currLoc;
            paramPtr = NULL;
            nParams  = 1;

            /*  Search for closing parenthesis  */

            done = 0;
            while( !done && !*status && *currLoc ) {
               switch (*currLoc) {
               case '(':
                  *currLoc = '\0';
                  currLoc++;
                  if( paramPtr )   /* Can't have two '(' in a region! */
                     *status = 1;
                  else
                     paramPtr = currLoc;
                  break;
               case ')':
                  *currLoc = '\0';
                  currLoc++;
                  if( !paramPtr )  /* Can't have a ')' without a '(' first */
                     *status = 1;
                  else
                     done = 1;
                  break;
               case '#':
               case '\n':
                  *currLoc = '\0';
                  if( !paramPtr )  /* Allow for a blank line */
                     done = 1;
                  break;
               case ':':  
                  currLoc++;
                  if ( paramPtr ) cFmt = hhmmss_fmt; /* set format if parameter has : */
                  break;
               case 'd':
                  currLoc++;
                  if ( paramPtr ) cFmt = degree_fmt; /* set format if parameter has d */  
                  break;
               case ',':
                  nParams++;  /* Fall through to default */
               default:
                  currLoc++;
                  break;
               }
            }
            if( *status || !done ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /*  Skip white space in region name  */

            while( isspace(*namePtr) ) namePtr++;

            /*  Was this a blank line? Or the end of the current one  */

            if( ! *namePtr && ! paramPtr ) continue;

            /*  Check for format code at beginning of the line */

            if( !fits_strncasecmp( namePtr, "image;", 6 ) ) {
				namePtr += 6;
				cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "physical;", 9 ) ) {
                                namePtr += 9;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "linear;", 7 ) ) {
                                namePtr += 7;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk4;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk5;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "icrs;", 5 ) ) {
				namePtr += 5;
				cFmt = degree_fmt;

            /* the following 5 cases support region files created by POW 
	       (or ds9 Version 4.x) which
               may have lines containing  only a format code, not followed
               by a ';' (and with no region specifier on the line).  We use
               the 'continue' statement to jump to the end of the loop and
               then continue reading the next line of the region file. */

            } else if( !fits_strncasecmp( namePtr, "fk5", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "fk4", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "icrs", 4 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "image", 5 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "physical", 8 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */


            } else if( !fits_strncasecmp( namePtr, "galactic;", 9 ) ) {
               ffpmsg( "Galactic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            } else if( !fits_strncasecmp( namePtr, "ecliptic;", 9 ) ) {
               ffpmsg( "ecliptic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /**************************************************/
            /*  We've apparently found a region... Set it up  */
            /**************************************************/

            if( !(aRgn->nShapes % 10) ) {
               if( aRgn->Shapes )
                  tmpShape = (RgnShape *)realloc( aRgn->Shapes,
                                                  (10+aRgn->nShapes)
                                                  * sizeof(RgnShape) );
               else
                  tmpShape = (RgnShape *) malloc( 10 * sizeof(RgnShape) );
               if( tmpShape ) {
                  aRgn->Shapes = tmpShape;
               } else {
                  ffpmsg( "Failed to allocate memory for Region data");
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }

            }
            newShape        = &aRgn->Shapes[aRgn->nShapes++];
            newShape->sign  = 1;
            newShape->shape = point_rgn;
	    for (i=0; i<8; i++) newShape->param.gen.p[i] = 0.0;
	    newShape->param.gen.a = 0.0;
	    newShape->param.gen.b = 0.0;
	    newShape->param.gen.sinT = 0.0;
	    newShape->param.gen.cosT = 0.0;

            while( isspace(*namePtr) ) namePtr++;
            
			/*  Check for the shape's sign  */

            if( *namePtr=='+' ) {
               namePtr++;
            } else if( *namePtr=='-' ) {
               namePtr++;
               newShape->sign = 0;
            }

            /* Skip white space in region name */

            while( isspace(*namePtr) ) namePtr++;
            if( *namePtr=='\0' ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            lineLen = strlen( namePtr ) - 1;
            while( isspace(namePtr[lineLen]) ) namePtr[lineLen--] = '\0';

            /*  Now identify the region  */

            if(        !fits_strcasecmp( namePtr, "circle"  ) ) {
               newShape->shape = circle_rgn;
               if( nParams != 3 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "annulus" ) ) {
               newShape->shape = annulus_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "ellipse" ) ) {
               if( nParams < 4 || nParams > 8 ) {
                  *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = ellipse_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		 newShape->shape = elliptannulus_rgn;
		 newShape->param.gen.p[6] = 0.0;
		 newShape->param.gen.p[7] = 0.0;
	       }
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "elliptannulus" ) ) {
               newShape->shape = elliptannulus_rgn;
               if( !( nParams==8 || nParams==6 ) )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[6] = 0.0;
               newShape->param.gen.p[7] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "box"    ) 
                    || !fits_strcasecmp( namePtr, "rotbox" ) ) {
	       if( nParams < 4 || nParams > 8 ) {
		 *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = box_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		  newShape->shape = boxannulus_rgn;
		  newShape->param.gen.p[6] = 0.0;
		  newShape->param.gen.p[7] = 0.0;
	       }
	       nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "rectangle"    )
                    || !fits_strcasecmp( namePtr, "rotrectangle" ) ) {
               newShape->shape = rectangle_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "diamond"    )
                    || !fits_strcasecmp( namePtr, "rotdiamond" )
                    || !fits_strcasecmp( namePtr, "rhombus"    )
                    || !fits_strcasecmp( namePtr, "rotrhombus" ) ) {
               newShape->shape = diamond_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "sector"  )
                    || !fits_strcasecmp( namePtr, "pie"     ) ) {
               newShape->shape = sector_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "point"   ) ) {
               newShape->shape = point_rgn;
               if( nParams != 2 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "line"    ) ) {
               newShape->shape = line_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "polygon" ) ) {
               newShape->shape = poly_rgn;
               if( nParams < 6 || (nParams&1) )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = nParams;
            } else if( !fits_strcasecmp( namePtr, "panda" ) ) {
               newShape->shape = panda_rgn;
               if( nParams != 8 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "epanda" ) ) {
               newShape->shape = epanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "bpanda" ) ) {
               newShape->shape = bpanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else {
               ffpmsg( "Unrecognized region found in region file:" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            if( *status ) {
               ffpmsg( "Wrong number of parameters found for region" );
               ffpmsg( namePtr );
               goto error;
            }

            /*  Parse Parameter string... convert to pixels if necessary  */

            if( newShape->shape==poly_rgn ) {
               newShape->param.poly.Pts = (double *)malloc( nParams
                                                            * sizeof(double) );
               if( !newShape->param.poly.Pts ) {
                  ffpmsg(
                      "Could not allocate memory to hold polygon parameters" );
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }
               newShape->param.poly.nPts = nParams;
               coords = newShape->param.poly.Pts;
            } else
               coords = newShape->param.gen.p;

            /*  Parse the initial "WCS?" coordinates  */
            for( i=0; i<nCoords; i+=2 ) {

               pX = paramPtr;
               while( *paramPtr!=',' ) paramPtr++;
               *(paramPtr++) = '\0';

               pY = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';

               if( strchr(pX, ':' ) ) {
                  /*  Read in special format & convert to decimal degrees  */
                  cFmt = hhmmss_fmt;
                  mm = 0;
                  ss = 0.;
                  hh = strtol(pX, &endp, 10);
                  if (endp && *endp==':') {
                      pX = endp + 1;
                      mm = strtol(pX, &endp, 10);
                      if (endp && *endp==':') {
                          pX = endp + 1;
                          ss = atof( pX );
                      }
                  }
                  X = 15. * (hh + mm/60. + ss/3600.); /* convert to degrees */

                  mm = 0;
                  ss = 0.;
                  negdec = 0;

                  while( isspace(*pY) ) pY++;
                  if (*pY=='-') {
                      negdec = 1;
                      pY++;
                  }
                  dd = strtol(pY, &endp, 10);
                  if (endp && *endp==':') {
                      pY = endp + 1;
                      mm = strtol(pY, &endp, 10);
                      if (endp && *endp==':') {
                          pY = endp + 1;
                          ss = atof( pY );
                      }
                  }
                  if (negdec)
                     Y = -dd - mm/60. - ss/3600.; /* convert to degrees */
                  else
                     Y = dd + mm/60. + ss/3600.;

               } else {
                  X = atof( pX );
                  Y = atof( pY );
               }
               if (i==0) {   /* save 1st coord. in case needed later */
                   xsave = X;
                   ysave = Y;
               }

               if( cFmt!=pixel_fmt ) {
                  /*  Convert to pixels  */
                  if( wcs==NULL || ! wcs->exists ) {
                     ffpmsg("WCS information needed to convert region coordinates.");
                     *status = NO_WCS_KEY;
                     goto error;
                  }
                  
                  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
                                      wcs->xrefpix, wcs->yrefpix,
                                      wcs->xinc,    wcs->yinc,
                                      wcs->rot,     wcs->type,
                              &x, &y, status ) ) {
                     ffpmsg("Error converting region to pixel coordinates.");
                     goto error;
                  }
                  X = x; Y = y;
               }
               coords[i]   = X;
               coords[i+1] = Y;

            }

            /*  Read in remaining parameters...  */

            for( ; i<nParams; i++ ) {
               pX = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';
               coords[i] = strtod( pX, &endp );

	       if (endp && (*endp=='"' || *endp=='\'' || *endp=='d') ) {
		  div = 1.0;
		  if ( *endp=='"' ) div = 3600.0;
		  if ( *endp=='\'' ) div = 60.0;
		  /* parameter given in arcsec so convert to pixels. */
		  /* Increment first Y coordinate by this amount then calc */
		  /* the distance in pixels from the original coordinate. */
		  /* NOTE: This assumes the pixels are square!! */
		  if (ysave < 0.)
		     Y = ysave + coords[i]/div;  /* don't exceed -90 */
		  else
		     Y = ysave - coords[i]/div;  /* don't exceed +90 */

		  X = xsave;
		  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
			       wcs->xrefpix, wcs->yrefpix,
			       wcs->xinc,    wcs->yinc,
			       wcs->rot,     wcs->type,
                               &x, &y, status ) ) {
		     ffpmsg("Error converting region to pixel coordinates.");
		     goto error;
		  }
		 
		  coords[i] = sqrt( pow(x-coords[0],2) + pow(y-coords[1],2) );

               }
            }

	    /* special case for elliptannulus and boxannulus if only one angle
	       was given */

	    if ( (newShape->shape == elliptannulus_rgn || 
		  newShape->shape == boxannulus_rgn ) && nParams == 7 ) {
	      coords[7] = coords[6];
	    }

            /* Also, correct the position angle for any WCS rotation:  */
            /*    If regions are specified in WCS coordintes, then the angles */
            /*    are relative to the WCS system, not the pixel X,Y system */

	    if( cFmt!=pixel_fmt ) {	    
	      switch( newShape->shape ) {
	      case sector_rgn:
	      case panda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		break;
	      case box_rgn:
	      case rectangle_rgn:
	      case diamond_rgn:
	      case ellipse_rgn:
		coords[4] += (wcs->rot);
		break;
	      case boxannulus_rgn:
	      case elliptannulus_rgn:
		coords[6] += (wcs->rot);
		coords[7] += (wcs->rot);
		break;
	      case epanda_rgn:
	      case bpanda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		coords[10] += (wcs->rot);
              default:
                break;
	      }
	    }

	    /* do some precalculations to speed up tests */

	    fits_setup_shape(newShape);

         }  /* End of while( *currLoc ) */
/*
  if (coords)printf("%.8f %.8f %.8f %.8f %.8f\n",
   coords[0],coords[1],coords[2],coords[3],coords[4]); 
*/
      }  /* End of if...else parse line */
   }   /* End of while( fgets(rgnFile) ) */

   /* set up component numbers */

   fits_set_region_components( aRgn );

error:

   if( *status ) {
      fits_free_region( aRgn );
   } else {
      *Rgn = aRgn;
   }

   fclose( rgnFile );
   free( currLine );

   return( *status );
}